

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expected-main.t.hpp
# Opt level: O0

ostream * lest::operator<<(ostream *os,expected<Implicit,_char> *v)

{
  ostream *poVar1;
  value_type *item;
  bool local_be;
  allocator local_a9;
  string local_a8 [32];
  string local_88 [39];
  byte local_61;
  lest local_60 [32];
  string local_40 [32];
  expected *local_20;
  expected<Implicit,_char> *v_local;
  ostream *os_local;
  
  local_20 = (expected *)v;
  v_local = (expected<Implicit,_char> *)os;
  poVar1 = std::operator<<(os,"[expected:");
  local_be = nonstd::expected_lite::expected::operator_cast_to_bool(local_20);
  local_61 = 0;
  if (local_be) {
    item = nonstd::expected_lite::expected<Implicit,_char>::operator*
                     ((expected<Implicit,_char> *)local_20);
    to_string<Implicit>(local_60,item);
    local_61 = 1;
    std::__cxx11::string::string(local_40,(string *)local_60);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"[empty]",&local_a9);
    std::__cxx11::string::string(local_88,local_a8);
    std::__cxx11::string::string(local_40,local_88);
  }
  local_be = !local_be;
  poVar1 = std::operator<<(poVar1,local_40);
  os_local = std::operator<<(poVar1,"]");
  std::__cxx11::string::~string(local_40);
  if (local_be) {
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  }
  if ((local_61 & 1) != 0) {
    std::__cxx11::string::~string((string *)local_60);
  }
  return os_local;
}

Assistant:

inline std::ostream & operator<<( std::ostream & os, nonstd::expected<T,E> const & v )
{
    using lest::to_string;
    return os << "[expected:" << (v ? to_string(*v) : "[empty]") << "]";
}